

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_send
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t result,sysbvm_tuple_t selector,sysbvm_tuple_t receiver,
          sysbvm_tuple_t arguments)

{
  sysbvm_tuple_t sVar1;
  ulong uVar2;
  undefined8 uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  bVar5 = (arguments & 0xf) != 0;
  if (bVar5 || arguments == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)(*(uint *)(arguments + 0xc) >> 3);
  }
  sysbvm_functionBytecodeAssembler_countExtension(context,assembler,uVar4 >> 4);
  sVar1 = sysbvm_array_create(context,uVar4 + 3);
  bVar6 = (sVar1 & 0xf) == 0;
  if (bVar6 && sVar1 != 0) {
    *(sysbvm_tuple_t *)(sVar1 + 0x10) = result;
    *(sysbvm_tuple_t *)(sVar1 + 0x18) = selector;
    *(sysbvm_tuple_t *)(sVar1 + 0x20) = receiver;
  }
  for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    if (bVar5 || arguments == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(undefined8 *)(arguments + 0x10 + uVar2 * 8);
    }
    if (bVar6 && sVar1 != 0) {
      *(undefined8 *)(sVar1 + 0x28 + uVar2 * 8) = uVar3;
    }
  }
  sVar1 = sysbvm_functionBytecodeAssemblerInstruction_create(context,'`',sVar1);
  sysbvm_functionBytecodeAssembler_addInstruction(assembler,sVar1);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_send(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t result, sysbvm_tuple_t selector, sysbvm_tuple_t receiver, sysbvm_tuple_t arguments)
{
    size_t argumentCount = sysbvm_array_getSize(arguments);
    sysbvm_functionBytecodeAssembler_countExtension(context, assembler, argumentCount>>4);

    sysbvm_tuple_t operands = sysbvm_array_create(context, 3 + argumentCount);
    sysbvm_array_atPut(operands, 0, result);
    sysbvm_array_atPut(operands, 1, selector);
    sysbvm_array_atPut(operands, 2, receiver);
    for(size_t i = 0; i < argumentCount; ++i)
        sysbvm_array_atPut(operands, 3 + i, sysbvm_array_at(arguments, i));
    
    sysbvm_tuple_t instruction = sysbvm_functionBytecodeAssemblerInstruction_create(context, SYSBVM_OPCODE_SEND, operands);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler, instruction);
    return instruction;
}